

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  MatchProperties match_properties_00;
  undefined1 local_218 [8];
  string newToFile;
  string newFromFile;
  MatchProperties match_properties;
  ostringstream local_1a0 [8];
  ostringstream e;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"INSTALL encountered an empty string input file name.");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,(string *)&match_properties);
    std::__cxx11::string::~string((string *)&match_properties);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return false;
  }
  match_properties_00 = CollectMatchProperties(this,fromFile);
  if (((ulong)match_properties_00 & 1) == 0) {
    bVar1 = cmsys::SystemTools::SameFile(fromFile,toFile);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)(newToFile.field_2._M_local_buf + 8),(string *)fromFile);
      std::__cxx11::string::string((string *)local_218,(string *)toFile);
      if (((this->FollowSymlinkChain & 1U) == 0) ||
         (bVar1 = InstallSymlinkChain(this,(string *)((long)&newToFile.field_2 + 8),
                                      (string *)local_218), bVar1)) {
        bVar1 = cmsys::SystemTools::FileIsSymlink((string *)((long)&newToFile.field_2 + 8));
        if (bVar1) {
          this_local._7_1_ =
               InstallSymlink(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_218);
        }
        else {
          bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&newToFile.field_2 + 8));
          if (bVar1) {
            this_local._7_1_ =
                 InstallDirectory(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_218,
                                  match_properties_00);
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists((string *)((long)&newToFile.field_2 + 8));
            if (bVar1) {
              this_local._7_1_ =
                   InstallFile(this,(string *)((long)&newToFile.field_2 + 8),(string *)local_218,
                               match_properties_00);
            }
            else {
              iVar2 = (*this->_vptr_cmFileCopier[5])
                                (this,(undefined1 *)((long)&newToFile.field_2 + 8));
              this_local._7_1_ = (bool)((byte)iVar2 & 1);
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_218);
      std::__cxx11::string::~string((string *)(newToFile.field_2._M_local_buf + 8));
      return this_local._7_1_;
    }
    return true;
  }
  return true;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}